

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

bool __thiscall
iDynTree::AttitudeQuaternionEKF::updateFilterWithMeasurements
          (AttitudeQuaternionEKF *this,LinearAccelerometerMeasurements *linAccMeas,
          GyroscopeMeasurements *gyroMeas,MagnetometerMeasurements *magMeas)

{
  undefined1 uVar1;
  byte bVar2;
  undefined1 uVar3;
  byte bVar4;
  bool bVar5;
  long lVar6;
  Scalar *pSVar7;
  Scalar __y;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *in_RCX;
  Vector3 *in_RDX;
  char *in_RSI;
  long in_RDI;
  double dVar8;
  Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> A_R_B;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> m_yB;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> m_B_modified;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> m_A;
  Vector3 magMeasUnitVector;
  Vector3 modified_mag_meas_in_body_frame;
  Vector3 mag_meas_in_inertial_frame;
  Vector3 linAccMeasUnitVector;
  DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *in_stack_fffffffffffffe08;
  undefined6 in_stack_fffffffffffffe10;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *other;
  undefined6 in_stack_fffffffffffffe28;
  Vector3 *out;
  Vector3 *in;
  undefined6 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe46;
  undefined1 in_stack_fffffffffffffe47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 in_stack_fffffffffffffe6f;
  string *in_stack_fffffffffffffe70;
  Vector3 *in_stack_fffffffffffffe78;
  AttitudeQuaternionEKF *in_stack_fffffffffffffea8;
  VectorFixSize<3U> local_110;
  VectorFixSize<3U> local_f8;
  VectorFixSize<3U> local_e0;
  VectorFixSize<3U> local_c8;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> local_a9;
  string local_a8 [39];
  undefined1 local_81 [56];
  undefined1 local_49 [33];
  DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *local_28;
  Vector3 *local_20;
  char *local_18;
  bool local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  lVar6 = iDynTree::VectorDynSize::size();
  if (lVar6 != *(long *)(in_RDI + 0x3e0)) {
    iDynTree::VectorDynSize::resize(in_RDI + 0x398);
  }
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,local_18,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffe47,
                      CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
  uVar1 = checkValidMeasurement
                    (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                     (bool)in_stack_fffffffffffffe6f);
  bVar2 = uVar1 ^ 0xff;
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  if ((bVar2 & 1) == 0) {
    in = (Vector3 *)local_81;
    out = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,local_18,
               (allocator<char> *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_fffffffffffffe40)));
    uVar3 = checkValidMeasurement
                      (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                       (bool)in_stack_fffffffffffffe6f);
    bVar4 = uVar3 ^ 0xff;
    std::__cxx11::string::~string((string *)(local_81 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_81);
    if ((bVar4 & 1) == 0) {
      other = &local_a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,local_18,
                 (allocator<char> *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_fffffffffffffe40)));
      uVar1 = checkValidMeasurement
                        (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                         (bool)in_stack_fffffffffffffe6f);
      bVar2 = uVar1 ^ 0xff;
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      if ((bVar2 & 1) == 0) {
        VectorFixSize<3U>::VectorFixSize(&local_c8);
        bVar5 = getUnitVector(in,out);
        if (bVar5) {
          *(double *)(in_RDI + 0x358) = local_c8.m_data[0];
          *(double *)(in_RDI + 0x360) = local_c8.m_data[1];
          *(double *)(in_RDI + 0x368) = local_c8.m_data[2];
          *(double *)(in_RDI + 0x340) = local_20->m_data[0];
          *(double *)(in_RDI + 0x348) = local_20->m_data[1];
          *(double *)(in_RDI + 0x350) = local_20->m_data[2];
          VectorFixSize<3U>::VectorFixSize(&local_e0);
          VectorFixSize<3U>::VectorFixSize(&local_f8);
          VectorFixSize<3U>::VectorFixSize(&local_110);
          bVar5 = getUnitVector(in,out);
          if (bVar5) {
            toEigen<3U>((VectorFixSize<3U> *)
                        CONCAT17(uVar3,CONCAT16(bVar4,in_stack_fffffffffffffe28)));
            toEigen<3U>((VectorFixSize<3U> *)
                        CONCAT17(uVar3,CONCAT16(bVar4,in_stack_fffffffffffffe28)));
            toEigen<3U>((VectorFixSize<3U> *)
                        CONCAT17(uVar3,CONCAT16(bVar4,in_stack_fffffffffffffe28)));
            toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)
                           CONCAT17(uVar3,CONCAT16(bVar4,in_stack_fffffffffffffe28)));
            Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>::
            operator*((MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                       *)CONCAT17(uVar3,CONCAT16(bVar4,in_stack_fffffffffffffe28)),other);
            Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
                      ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
                       CONCAT17(uVar1,CONCAT16(bVar2,in_stack_fffffffffffffe10)),
                       (DenseBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                        *)in_stack_fffffffffffffe08);
            pSVar7 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_fffffffffffffe10)),
                                  (Index)in_stack_fffffffffffffe08);
            *pSVar7 = 0.0;
            Eigen::
            DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>::
            transpose(local_28);
            Eigen::
            MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>>
            ::operator*((MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>_>
                         *)CONCAT17(uVar3,CONCAT16(bVar4,in_stack_fffffffffffffe28)),other);
            Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
                      ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
                       CONCAT17(uVar1,CONCAT16(bVar2,in_stack_fffffffffffffe10)),
                       in_stack_fffffffffffffe08);
            pSVar7 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_fffffffffffffe10)),
                                  (Index)in_stack_fffffffffffffe08);
            __y = -*pSVar7;
            pSVar7 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_fffffffffffffe10)),
                                  (Index)__y);
            dVar8 = atan2(__y,*pSVar7);
            *(double *)(in_RDI + 0x370) = dVar8;
            bVar5 = callEkfUpdate(in_stack_fffffffffffffea8);
            if (bVar5) {
              local_1 = true;
            }
            else {
              local_1 = false;
            }
          }
          else {
            iDynTree::reportError
                      ("AttitudeQuaternionEKF","updateFilterWithMeasurements",
                       "Cannot retrieve unit vector from magnetometer measuremnts.");
            local_1 = false;
          }
        }
        else {
          iDynTree::reportError
                    ("AttitudeQuaternionEKF","updateFilterWithMeasurements",
                     "Cannot retrieve unit vector from linear acceleration measuremnts.");
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::updateFilterWithMeasurements(const iDynTree::LinearAccelerometerMeasurements& linAccMeas, const iDynTree::GyroscopeMeasurements& gyroMeas, const iDynTree::MagnetometerMeasurements& magMeas)
{
    if (m_y.size() != m_output_size)
    {
        m_y.resize(m_output_size);
    }

    if (!checkValidMeasurement(linAccMeas, "linear acceleration", true)) { return false; }
    if (!checkValidMeasurement(gyroMeas, "gyroscope", false)) { return false; }
    if (!checkValidMeasurement(magMeas, "magnetometer", true)) { return false; }

    iDynTree::Vector3 linAccMeasUnitVector;
    if (!getUnitVector(linAccMeas, linAccMeasUnitVector))
    {
        iDynTree::reportError("AttitudeQuaternionEKF", "updateFilterWithMeasurements", "Cannot retrieve unit vector from linear acceleration measuremnts.");
        return false;
    }

    m_Acc_y = linAccMeasUnitVector;
    m_Omega_y = gyroMeas;

    // compute yaw angle from magnetometer measurements by limiting the vertical influence of magentometer
    // to do this first rotate the measurement to inertial frame, set z-component to zero.
    // convert back to body frame and compute the yaw using atan2(y, x)
    iDynTree::Vector3 mag_meas_in_inertial_frame;
    iDynTree::Vector3 modified_mag_meas_in_body_frame;
    iDynTree::Vector3 magMeasUnitVector;
    if (!getUnitVector(magMeas, magMeasUnitVector))
    {
        iDynTree::reportError("AttitudeQuaternionEKF", "updateFilterWithMeasurements", "Cannot retrieve unit vector from magnetometer measuremnts.");
        return false;
    }

    using iDynTree::toEigen;
    auto m_A(toEigen(mag_meas_in_inertial_frame));
    auto m_B_modified(toEigen(modified_mag_meas_in_body_frame));
    auto m_yB(toEigen(magMeasUnitVector));
    auto A_R_B(toEigen(m_orientationInSO3));

    m_A = A_R_B * m_yB;
    m_A(2) = 0; // to limit the vertical influence of magnetometer {^A}m_z = 0
    m_B_modified = A_R_B.transpose()* m_A; // rotate vector back to body frame
    m_Mag_y = std::atan2(-m_B_modified(1), m_B_modified(0));

    // set accelerometer and magnetometer measurement
    if (!callEkfUpdate())
    {
        return false;
    }

    return true;
}